

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall
NLProblemBuilderTest_AddVars_Test::~NLProblemBuilderTest_AddVars_Test
          (NLProblemBuilderTest_AddVars_Test *this)

{
  (this->super_NLProblemBuilderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NLProblemBuilderTest_002f3a28;
  testing::StrictMock<MockProblemBuilder>::~StrictMock(&(this->super_NLProblemBuilderTest).builder);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x1c70);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, AddVars) {
  auto header = mp::NLHeader();
  header.num_vars = 42;
  EXPECT_CALL(builder, SetInfo(testing::Ref(header)));
  EXPECT_CALL(builder, AddVars(header.num_vars, mp::var::CONTINUOUS));
  adapter.OnHeader(header);
  header.num_linear_integer_vars = 42;
  EXPECT_CALL(builder, SetInfo(testing::Ref(header)));
  EXPECT_CALL(builder, AddVars(header.num_vars, mp::var::INTEGER));
  adapter.OnHeader(header);
  header.num_linear_integer_vars = 10;
  EXPECT_CALL(builder, SetInfo(testing::Ref(header)));
  EXPECT_CALL(builder, AddVars(header.num_linear_integer_vars,
                               mp::var::INTEGER));
  EXPECT_CALL(builder, AddVars(header.num_vars - header.num_linear_integer_vars,
                               mp::var::CONTINUOUS));
  adapter.OnHeader(header);
}